

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void __thiscall TestMaterial::RandomTestSupportFunction(TestMaterial *this)

{
  int iVar1;
  ostream *poVar2;
  time_t tVar3;
  reference pvVar4;
  clock_t cVar5;
  S_Object *pSVar6;
  double dVar7;
  double dVar8;
  double local_e8;
  double local_e0;
  double local_d8;
  size_type local_d0;
  long j_1;
  double local_c0;
  double local_b8;
  Vector3T<double,_false> local_b0;
  double local_98;
  double d;
  double c;
  double b;
  double a;
  long j;
  undefined1 local_68 [8];
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_> v
  ;
  clock_t end;
  clock_t begin;
  allocator<CD_Matrix::Vector3T<double,_false>_> local_29;
  undefined1 local_28 [8];
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  supportVector;
  TestMaterial *this_local;
  
  supportVector.
  super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"RandomTestSupportFunction");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::allocator<CD_Matrix::Vector3T<double,_false>_>::allocator(&local_29);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
          *)local_28,1000000,&local_29);
  std::allocator<CD_Matrix::Vector3T<double,_false>_>::~allocator(&local_29);
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  std::allocator<CD_Matrix::Vector3T<double,_false>_>::allocator
            ((allocator<CD_Matrix::Vector3T<double,_false>_> *)((long)&j + 7));
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
          *)local_68,1000000,(allocator<CD_Matrix::Vector3T<double,_false>_> *)((long)&j + 7));
  std::allocator<CD_Matrix::Vector3T<double,_false>_>::~allocator
            ((allocator<CD_Matrix::Vector3T<double,_false>_> *)((long)&j + 7));
  for (a = 0.0; (long)a < 1000000; a = (double)((long)a + 1)) {
    iVar1 = rand();
    b = (double)iVar1 / 2147483647.0;
    iVar1 = rand();
    c = (double)iVar1 / 2147483647.0;
    iVar1 = rand();
    d = (double)iVar1 / 2147483647.0;
    iVar1 = rand();
    local_98 = (double)iVar1 / 2147483647.0;
    dVar7 = log(b);
    dVar7 = sqrt(dVar7 * -2.0);
    local_b8 = cos(c * 6.283185307179586);
    local_b8 = dVar7 * local_b8;
    dVar7 = log(c);
    dVar7 = sqrt(dVar7 * -2.0);
    local_c0 = cos(b * 6.283185307179586);
    local_c0 = dVar7 * local_c0;
    dVar7 = log(d);
    dVar7 = sqrt(dVar7 * -2.0);
    dVar8 = cos(local_98 * 6.283185307179586);
    j_1 = (long)(dVar7 * dVar8);
    CD_Matrix::Vector3T<double,_false>::Vector3T(&local_b0,&local_b8,&local_c0,(double *)&j_1);
    pvVar4 = std::
             vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
             ::operator[]((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                           *)local_68,(size_type)a);
    pvVar4->m_x = local_b0.m_x;
    pvVar4->m_y = local_b0.m_y;
    pvVar4->m_z = local_b0.m_z;
  }
  cVar5 = clock();
  for (local_d0 = 0; (long)local_d0 < 1000000; local_d0 = local_d0 + 1) {
    pSVar6 = sch::CD_Scene::operator[](&this->sObj,(ulong)this->CurrentObj);
    pvVar4 = std::
             vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
             ::operator[]((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                           *)local_68,local_d0);
    (**(code **)(*(long *)pSVar6 + 0x20))(&local_e8,pSVar6,pvVar4);
    pvVar4 = std::
             vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
             ::operator[]((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                           *)local_28,local_d0);
    pvVar4->m_x = local_e8;
    pvVar4->m_y = local_e0;
    pvVar4->m_z = local_d8;
  }
  v.
  super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)clock();
  poVar2 = std::operator<<((ostream *)&std::cout,"  computation time: ");
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(double)((long)v.
                                            super__Vector_base<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                     cVar5) / 1000000.0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  ~vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
           *)local_68);
  std::
  vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>::
  ~vector((vector<CD_Matrix::Vector3T<double,_false>,_std::allocator<CD_Matrix::Vector3T<double,_false>_>_>
           *)local_28);
  return;
}

Assistant:

void TestMaterial::RandomTestSupportFunction()
{
  std::cout << "RandomTestSupportFunction" << std::endl;
  std::vector<Vector3> supportVector(RandomTestEnd);

  clock_t begin, end;
  srand(static_cast<unsigned int>(time(NULL)));



  std::vector<Vector3> v(RandomTestEnd);

  for (long j=0; j<RandomTestEnd; j++)
  {

    double a = (rand()/double(RAND_MAX)) ;
    double b = (rand()/double(RAND_MAX)) ;
    double c = (rand()/double(RAND_MAX)) ;
    double d = (rand()/double(RAND_MAX)) ;

    v[j]=Vector3(sqrt(-2*log(a))*cos(2*PI*b),sqrt(-2*log(b))*cos(2*PI*a),sqrt(-2*log(c))*cos(2*PI*d));
  }

  begin=clock();

  for (long j=0; j<RandomTestEnd; j++)
  {
#ifdef DO_TEST
    supportVector[j] = sObj[CurrentObj]->support(v[j]);
#endif
  }

  end=clock();

  std::cout << "  computation time: " << ((double)(end- begin) / CLOCKS_PER_SEC) <<  std::endl;

  // print the data in a file
#ifdef OUTPUT_FILE
  std::fstream outfile;
  outfile.open("/tmp/sch_randomtestsupport_result.txt",std::ios_base::out|std::ios_base::trunc);
  outfile.precision(18);
  for (long j=0; j<RandomTestEnd; j++)
    outfile<< supportVector[j] <<std::endl;
  outfile.close();
#endif // OUTPUT_FILE
}